

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

size_t roaring_bitmap_shrink_to_fit(roaring_bitmap_t *r)

{
  uint8_t uVar1;
  int iVar2;
  _Bool _Var3;
  int iVar4;
  long lVar5;
  array_container_t *src;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  
  iVar4 = (r->high_low_container).size;
  uVar8 = 0;
  lVar6 = 0;
  if (0 < iVar4) {
    do {
      uVar1 = (r->high_low_container).typecodes[uVar8 & 0xffff];
      src = (array_container_t *)(r->high_low_container).containers[uVar8 & 0xffff];
      if (uVar1 == '\x04') {
        uVar1 = *(uint8_t *)&src->array;
        if (uVar1 == '\x04') {
          __assert_fail("*type != SHARED_CONTAINER_TYPE",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                        ,0x1070,
                        "container_t *container_mutable_unwrap_shared(container_t *, uint8_t *)");
        }
        src = *(array_container_t **)src;
      }
      if (uVar1 == '\x01') {
        iVar4 = 0;
      }
      else if (uVar1 == '\x03') {
        iVar4 = run_container_shrink_to_fit((run_container_t *)src);
      }
      else {
        if (uVar1 != '\x02') {
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                        ,0x1121,"int container_shrink_to_fit(container_t *, uint8_t)");
        }
        iVar4 = array_container_shrink_to_fit(src);
      }
      lVar6 = lVar6 + iVar4;
      uVar7 = (int)uVar8 + 1;
      uVar8 = (ulong)uVar7;
      iVar4 = (r->high_low_container).size;
    } while ((int)uVar7 < iVar4);
  }
  iVar2 = (r->high_low_container).allocation_size;
  _Var3 = realloc_array(&r->high_low_container,iVar4);
  if (_Var3) {
    (r->high_low_container).allocation_size = (r->high_low_container).size;
    lVar5 = (long)((iVar2 - iVar4) * 0xb);
  }
  else {
    lVar5 = 0;
  }
  return lVar5 + lVar6;
}

Assistant:

size_t roaring_bitmap_shrink_to_fit(roaring_bitmap_t *r) {
    size_t answer = 0;
    for (int i = 0; i < r->high_low_container.size; i++) {
        uint8_t type_original;
        container_t *c = ra_get_container_at_index(&r->high_low_container, i,
                                                   &type_original);
        answer += container_shrink_to_fit(c, type_original);
    }
    answer += ra_shrink_to_fit(&r->high_low_container);
    return answer;
}